

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_bddCreateExor(DdManager *dd,int nVars)

{
  DdNode *pDVar1;
  undefined4 local_2c;
  int i;
  DdNode *bTemp;
  DdNode *bFunc;
  int nVars_local;
  DdManager *dd_local;
  
  bTemp = Cudd_ReadLogicZero(dd);
  Cudd_Ref(bTemp);
  for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
    pDVar1 = Cudd_bddIthVar(dd,local_2c);
    pDVar1 = Cudd_bddXor(dd,bTemp,pDVar1);
    Cudd_Ref(pDVar1);
    Cudd_RecursiveDeref(dd,bTemp);
    bTemp = pDVar1;
  }
  Cudd_Deref(bTemp);
  return bTemp;
}

Assistant:

DdNode * Extra_bddCreateExor( DdManager * dd, int nVars )
{
    DdNode * bFunc, * bTemp;
    int i;
    bFunc = Cudd_ReadLogicZero(dd); Cudd_Ref( bFunc );
    for ( i = 0; i < nVars; i++ )
    {
        bFunc = Cudd_bddXor( dd, bTemp = bFunc, Cudd_bddIthVar(dd,i) );  Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bFunc );
    return bFunc;
}